

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O1

int archive_read_disk_entry_from_file(archive *_a,archive_entry *entry,int fd,stat *st)

{
  long offset;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  mode_t mVar5;
  int iVar6;
  char *pcVar7;
  la_int64_t lVar8;
  char *pcVar9;
  int *piVar11;
  ulong uVar12;
  ulong uVar13;
  size_t __size;
  long lVar14;
  byte *pbVar15;
  stat s;
  stat local_10c8;
  long local_1038 [2];
  undefined4 local_1028;
  uint local_1024;
  undefined4 local_1020;
  byte local_ff0 [4032];
  ssize_t sVar10;
  
  archive_clear_error(_a);
  pcVar7 = archive_entry_sourcepath(entry);
  if (pcVar7 == (char *)0x0) {
    pcVar7 = archive_entry_pathname(entry);
  }
  if (*(long *)&_a[1].archive_format == 0) {
    if (st == (stat *)0x0) {
      if (fd < 0) {
        if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
          st = &local_10c8;
          iVar3 = lstat(pcVar7,(stat *)st);
          if (iVar3 != 0) {
            piVar11 = __errno_location();
            iVar3 = *piVar11;
            pcVar9 = "Can\'t lstat %s";
            goto LAB_00453d02;
          }
        }
        else {
          st = &local_10c8;
          iVar3 = stat(pcVar7,(stat *)st);
          if (iVar3 != 0) {
            piVar11 = __errno_location();
            iVar3 = *piVar11;
            pcVar9 = "Can\'t stat %s";
LAB_00453d02:
            archive_set_error(_a,iVar3,pcVar9,pcVar7);
            return -0x19;
          }
        }
      }
      else {
        st = &local_10c8;
        iVar3 = fstat(fd,(stat *)st);
        if (iVar3 != 0) {
          piVar11 = __errno_location();
          iVar3 = *piVar11;
          pcVar7 = "Can\'t fstat";
          goto LAB_00453ba9;
        }
      }
    }
    archive_entry_copy_stat(entry,st);
  }
  lVar8 = archive_entry_uid(entry);
  pcVar9 = archive_read_disk_uname(_a,lVar8);
  if (pcVar9 != (char *)0x0) {
    archive_entry_copy_uname(entry,pcVar9);
  }
  lVar8 = archive_entry_gid(entry);
  pcVar9 = archive_read_disk_gname(_a,lVar8);
  if (pcVar9 != (char *)0x0) {
    archive_entry_copy_gname(entry,pcVar9);
  }
  if ((st->st_mode & 0xf000) == 0xa000) {
    __size = st->st_size + 1;
    pcVar9 = (char *)malloc(__size);
    if (pcVar9 == (char *)0x0) {
      pcVar7 = "Couldn\'t read link data";
      iVar3 = 0xc;
LAB_00453ba9:
      archive_set_error(_a,iVar3,pcVar7);
      return -0x19;
    }
    if (*(long *)&_a[1].archive_format == 0) {
      sVar10 = readlink(pcVar7,pcVar9,__size);
      uVar4 = (uint)sVar10;
    }
    else {
      iVar3 = (**(code **)&_a[1].compression_code)();
      sVar10 = readlinkat(iVar3,pcVar7,pcVar9,__size);
      uVar4 = (uint)sVar10;
    }
    if ((int)uVar4 < 0) {
      piVar11 = __errno_location();
      archive_set_error(_a,*piVar11,"Couldn\'t read link data");
      free(pcVar9);
      return -0x19;
    }
    pcVar9[uVar4 & 0x7fffffff] = '\0';
    archive_entry_set_symlink(entry,pcVar9);
    free(pcVar9);
  }
  mVar5 = archive_entry_filetype(entry);
  iVar6 = 0;
  iVar3 = fd;
  if (((mVar5 == 0x8000) && (lVar8 = archive_entry_size(entry), 0 < lVar8)) &&
     (pcVar7 = archive_entry_hardlink(entry), pcVar7 == (char *)0x0)) {
    if (fd < 0) {
      pcVar7 = archive_entry_sourcepath(entry);
      if (pcVar7 == (char *)0x0) {
        pcVar7 = archive_entry_pathname(entry);
      }
      if (*(long *)&_a[1].archive_format == 0) {
        iVar3 = open(pcVar7,0x80800);
      }
      else {
        iVar3 = (*(code *)_a[1].archive_format_name)(*(long *)&_a[1].archive_format,pcVar7,0x80800);
      }
      if (iVar3 < 0) {
        piVar11 = __errno_location();
        archive_set_error(_a,*piVar11,"Can\'t open `%s\'",pcVar7);
        iVar6 = -0x19;
        goto LAB_00453c62;
      }
      __archive_ensure_cloexec_flag(iVar3);
    }
    memset(local_1038,0,0x1000);
    local_1038[1] = 0xffffffffffffffff;
    local_1028 = 1;
    local_1020 = 0x48;
    uVar12 = archive_entry_size(entry);
    bVar1 = true;
    do {
      iVar6 = ioctl(iVar3,0xc020660b,local_1038);
      if ((iVar6 < 0) || (local_1024 == 0)) {
LAB_00453e81:
        bVar2 = false;
      }
      else {
        if (0 < (int)local_1024) {
          iVar6 = 0;
          pbVar15 = local_ff0;
          do {
            if ((pbVar15[1] & 8) == 0) {
              offset = *(long *)(pbVar15 + -0x28);
              uVar13 = offset + *(long *)(pbVar15 + -0x18);
              lVar14 = 0;
              if (uVar12 <= uVar13) {
                lVar14 = uVar13 - uVar12;
              }
              uVar13 = *(long *)(pbVar15 + -0x18) - lVar14;
              bVar2 = false;
              if ((uVar13 != uVar12 || offset != 0) && (bVar2 = bVar1, 0 < (long)uVar13)) {
                archive_entry_sparse_add_entry(entry,offset,uVar13);
              }
              bVar1 = bVar2;
              if (uVar13 == uVar12 && offset == 0) break;
            }
            if ((*pbVar15 & 1) != 0) {
              bVar1 = false;
            }
            iVar6 = iVar6 + 1;
            pbVar15 = pbVar15 + 0x38;
          } while (iVar6 < (int)local_1024);
        }
        if (!bVar1) {
          bVar1 = false;
          goto LAB_00453e81;
        }
        local_1038[0] =
             local_1038[(ulong)local_1024 * 7 + -1] +
             local_10c8.__glibc_reserved[(ulong)local_1024 * 7];
        bVar2 = true;
        bVar1 = true;
      }
    } while (bVar2);
    iVar6 = 0;
  }
LAB_00453c62:
  if (iVar3 != fd) {
    close(iVar3);
  }
  return iVar6;
}

Assistant:

int
archive_read_disk_entry_from_file(struct archive *_a,
    struct archive_entry *entry,
    int fd,
    const struct stat *st)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	const char *path, *name;
	struct stat s;
	int initial_fd = fd;
	int r, r1;

	archive_clear_error(_a);
	path = archive_entry_sourcepath(entry);
	if (path == NULL)
		path = archive_entry_pathname(entry);

	if (a->tree == NULL) {
		if (st == NULL) {
#if HAVE_FSTAT
			if (fd >= 0) {
				if (fstat(fd, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't fstat");
					return (ARCHIVE_FAILED);
				}
			} else
#endif
#if HAVE_LSTAT
			if (!a->follow_symlinks) {
				if (lstat(path, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't lstat %s", path);
					return (ARCHIVE_FAILED);
				}
			} else
#endif
			if (stat(path, &s) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't stat %s", path);
				return (ARCHIVE_FAILED);
			}
			st = &s;
		}
		archive_entry_copy_stat(entry, st);
	}

	/* Lookup uname/gname */
	name = archive_read_disk_uname(_a, archive_entry_uid(entry));
	if (name != NULL)
		archive_entry_copy_uname(entry, name);
	name = archive_read_disk_gname(_a, archive_entry_gid(entry));
	if (name != NULL)
		archive_entry_copy_gname(entry, name);

#ifdef HAVE_STRUCT_STAT_ST_FLAGS
	/* On FreeBSD, we get flags for free with the stat. */
	/* TODO: Does this belong in copy_stat()? */
	if (st->st_flags != 0)
		archive_entry_set_fflags(entry, st->st_flags, 0);
#endif

#if defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS)
	/* Linux requires an extra ioctl to pull the flags.  Although
	 * this is an extra step, it has a nice side-effect: We get an
	 * open file descriptor which we can use in the subsequent lookups. */
	if ((S_ISREG(st->st_mode) || S_ISDIR(st->st_mode))) {
		if (fd < 0) {
			if (a->tree != NULL)
				fd = a->open_on_current_dir(a->tree, path,
					O_RDONLY | O_NONBLOCK | O_CLOEXEC);
			else
				fd = open(path, O_RDONLY | O_NONBLOCK |
						O_CLOEXEC);
			__archive_ensure_cloexec_flag(fd);
		}
		if (fd >= 0) {
			int stflags;
			r = ioctl(fd, EXT2_IOC_GETFLAGS, &stflags);
			if (r == 0 && stflags != 0)
				archive_entry_set_fflags(entry, stflags, 0);
		}
	}
#endif

#if defined(HAVE_READLINK) || defined(HAVE_READLINKAT)
	if (S_ISLNK(st->st_mode)) {
		size_t linkbuffer_len = st->st_size + 1;
		char *linkbuffer;
		int lnklen;

		linkbuffer = malloc(linkbuffer_len);
		if (linkbuffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't read link data");
			return (ARCHIVE_FAILED);
		}
		if (a->tree != NULL) {
#ifdef HAVE_READLINKAT
			lnklen = readlinkat(a->tree_current_dir_fd(a->tree),
			    path, linkbuffer, linkbuffer_len);
#else
			if (a->tree_enter_working_dir(a->tree) != 0) {
				archive_set_error(&a->archive, errno,
				    "Couldn't read link data");
				free(linkbuffer);
				return (ARCHIVE_FAILED);
			}
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
#endif /* HAVE_READLINKAT */
		} else
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
		if (lnklen < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't read link data");
			free(linkbuffer);
			return (ARCHIVE_FAILED);
		}
		linkbuffer[lnklen] = 0;
		archive_entry_set_symlink(entry, linkbuffer);
		free(linkbuffer);
	}
#endif /* HAVE_READLINK || HAVE_READLINKAT */

	r = setup_acls(a, entry, &fd);
	if (!a->suppress_xattr) {
		r1 = setup_xattrs(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	if (a->enable_copyfile) {
		r1 = setup_mac_metadata(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	r1 = setup_sparse(a, entry, &fd);
	if (r1 < r)
		r = r1;

	/* If we opened the file earlier in this function, close it. */
	if (initial_fd != fd)
		close(fd);
	return (r);
}